

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_panel.cxx
# Opt level: O0

void template_delete_cb(Fl_Button *param_1,void *param_2)

{
  uint line;
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  int *piVar4;
  char *flfile;
  char *name;
  int item;
  void *param_1_local;
  Fl_Button *param_0_local;
  
  line = Fl_Browser::value(template_browser);
  if (0 < (int)line) {
    pcVar2 = Fl_Browser::text(template_browser,line);
    pcVar3 = (char *)Fl_Browser::data(template_browser,line);
    if ((pcVar3 != (char *)0x0) &&
       (iVar1 = fl_choice("Are you sure you want to delete the template \"%s\"?","Cancel","Delete",
                          (char *)0x0,pcVar2), iVar1 != 0)) {
      iVar1 = unlink(pcVar3);
      if (iVar1 == 0) {
        Fl_Browser::remove(template_browser,(char *)(ulong)line);
        Fl_Widget::do_callback((Fl_Widget *)template_browser);
      }
      else {
        piVar4 = __errno_location();
        pcVar3 = strerror(*piVar4);
        fl_alert("Unable to delete template \"%s\":\n%s",pcVar2,pcVar3);
      }
    }
  }
  return;
}

Assistant:

void template_delete_cb(Fl_Button *, void *) {
  int item = template_browser->value();
  if (item < 1) return;
  
  const char *name = template_browser->text(item);
  const char *flfile = (const char *)template_browser->data(item);
  if (!flfile) return;
  
  if (!fl_choice("Are you sure you want to delete the template \"%s\"?",
                 "Cancel", "Delete", 0, name)) return;
  
  if (unlink(flfile)) {
    fl_alert("Unable to delete template \"%s\":\n%s", name, strerror(errno));
    return;
  }
  
  template_browser->remove(item);
  template_browser->do_callback();
}